

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(ze_device_uuid_t val)

{
  byte bVar1;
  uint __len;
  long *plVar2;
  long *plVar3;
  long lVar4;
  string *in_RDI;
  string __str;
  string tmp;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  byte local_40 [16];
  
  local_88 = &in_RDI->field_2;
  (in_RDI->_M_dataplus)._M_p = (pointer)local_88;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  local_b0 = in_RDI;
  std::__cxx11::string::append((char *)in_RDI);
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  lVar4 = 0;
  do {
    bVar1 = local_40[lVar4];
    __len = 3 - (bVar1 < 100);
    if (bVar1 < 10) {
      __len = 1;
    }
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0,__len,(uint)bVar1);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    std::__cxx11::string::append((char *)&local_a8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  std::__cxx11::string::substr((ulong)local_60,(ulong)&local_a8);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x10b420);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  std::__cxx11::string::append((char *)local_b0);
  return local_b0;
}

Assistant:

std::string to_string( const ze_device_uuid_t val )
{
    std::string str;
    
    str += "device_uuid_t::id : ";
    {
        std::string tmp;
        for( auto& entry : val.id )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}